

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa_sig.c
# Opt level: O0

int ed25519_digest_sign(void *vpeddsactx,uchar *sigret,size_t *siglen,size_t sigsize,uchar *tbs,
                       size_t tbslen)

{
  int iVar1;
  ulong in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  char *in_RDI;
  ECX_KEY *edkey;
  PROV_EDDSA_CTX *peddsactx;
  OSSL_LIB_CTX *in_stack_00000128;
  uint8_t *in_stack_00000130;
  uint8_t *in_stack_00000138;
  size_t in_stack_00000140;
  uint8_t *in_stack_00000148;
  uint8_t *in_stack_00000150;
  char *in_stack_00000160;
  char *in_stack_ffffffffffffffb0;
  int line;
  int local_4;
  
  line = (int)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (in_RSI == 0) {
    *in_RDX = 0x40;
    local_4 = 1;
  }
  else if (in_RCX < 0x40) {
    ERR_new();
    ERR_set_debug(in_RDI,line,in_stack_ffffffffffffffb0);
    ERR_set_error(0x39,0x6a,(char *)0x0);
    local_4 = 0;
  }
  else {
    iVar1 = ossl_ed25519_sign(in_stack_00000150,in_stack_00000148,in_stack_00000140,
                              in_stack_00000138,in_stack_00000130,in_stack_00000128,
                              in_stack_00000160);
    if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug(in_RDI,line,in_stack_ffffffffffffffb0);
      ERR_set_error(0x39,0xaf,(char *)0x0);
      local_4 = 0;
    }
    else {
      *in_RDX = 0x40;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ed25519_digest_sign(void *vpeddsactx, unsigned char *sigret,
                        size_t *siglen, size_t sigsize,
                        const unsigned char *tbs, size_t tbslen)
{
    PROV_EDDSA_CTX *peddsactx = (PROV_EDDSA_CTX *)vpeddsactx;
    const ECX_KEY *edkey = peddsactx->key;

    if (!ossl_prov_is_running())
        return 0;

    if (sigret == NULL) {
        *siglen = ED25519_SIGSIZE;
        return 1;
    }
    if (sigsize < ED25519_SIGSIZE) {
        ERR_raise(ERR_LIB_PROV, PROV_R_OUTPUT_BUFFER_TOO_SMALL);
        return 0;
    }
#ifdef S390X_EC_ASM
    if (S390X_CAN_SIGN(ED25519))
        return s390x_ed25519_digestsign(edkey, sigret, tbs, tbslen);
#endif /* S390X_EC_ASM */
    if (ossl_ed25519_sign(sigret, tbs, tbslen, edkey->pubkey, edkey->privkey,
                          peddsactx->libctx, NULL) == 0) {
        ERR_raise(ERR_LIB_PROV, PROV_R_FAILED_TO_SIGN);
        return 0;
    }
    *siglen = ED25519_SIGSIZE;
    return 1;
}